

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O3

void anon_unknown.dwarf_24028::PrintWord(uint8_t *v,size_t size,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  size_t sVar3;
  
  if (size != 0) {
    sVar3 = 0;
    do {
      if (sVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      }
      lVar2 = *(long *)out;
      poVar1 = out + *(long *)(lVar2 + -0x18);
      if (out[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar1);
        poVar1[0xe1] = (ostream)0x1;
        lVar2 = *(long *)out;
      }
      poVar1[0xe0] = (ostream)0x30;
      *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 2;
      *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)out,(uint)v[sVar3]);
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
  }
  return;
}

Assistant:

void PrintWord(const uint8_t *v, size_t size, std::ostream &out) {
  size_t i;
  for (i = 0; i < size; i++) {
    if (i > 0)
      out << " ";
    out << std::setfill('0')
        << std::setw(2)
        << std::hex
        << (int)v[i];
  }
}